

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O0

VmBlock * GetLoopContinueBlock(VmModule *module,uint depth)

{
  LoopInfo *pLVar1;
  uint local_1c;
  uint local_18;
  uint i;
  uint pos;
  uint depth_local;
  VmModule *module_local;
  
  local_18 = SmallArray<VmModule::LoopInfo,_32U>::size(&module->loopInfo);
  for (local_1c = 0; local_1c < depth; local_1c = local_1c + 1) {
    do {
      local_18 = local_18 - 1;
      pLVar1 = SmallArray<VmModule::LoopInfo,_32U>::operator[](&module->loopInfo,local_18);
    } while (pLVar1->continueBlock == (VmBlock *)0x0);
  }
  pLVar1 = SmallArray<VmModule::LoopInfo,_32U>::operator[](&module->loopInfo,local_18);
  return pLVar1->continueBlock;
}

Assistant:

VmBlock* GetLoopContinueBlock(VmModule *module, unsigned depth)
{
	unsigned pos = module->loopInfo.size();

	for(unsigned i = 0; i < depth; i++)
	{
		pos--;

		while(!module->loopInfo[pos].continueBlock)
			pos--;
	}

	return module->loopInfo[pos].continueBlock;
}